

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void dump_level_body(ang_file *fo,char *title,chunk_conflict *c,int **dist)

{
  _Bool _Var1;
  loc grid;
  char *buf;
  object *poVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  
  file_put(fo,"    <p>");
  dump_level_escaped_string(fo,title);
  if (dist != (int **)0x0) {
    file_put(fo,"\n    <p>A location where the distance array was negative is marked with *.");
  }
  file_put(fo,"\n    <pre>\n");
  lVar5 = 0;
  do {
    if (c->height <= lVar5) {
      file_put(fo,"    </pre>\n");
      return;
    }
    for (lVar3 = 0; lVar3 < c->width; lVar3 = lVar3 + 1) {
      grid = (loc)loc((int)lVar3,(int)lVar5);
      _Var1 = square_in_bounds_fully(c,grid);
      buf = "#";
      if (_Var1) {
        _Var1 = square_isplayer(c,grid);
        buf = "@";
        if (!_Var1) {
          _Var1 = square_isoccupied(c,grid);
          if (_Var1) {
            pcVar4 = "M";
LAB_00153558:
            buf = pcVar4;
            if (dist == (int **)0x0) goto LAB_0015357c;
          }
          else {
            _Var1 = square_isdoor(c,grid);
            if (_Var1) {
              pcVar4 = "+";
              goto LAB_00153558;
            }
            _Var1 = square_isrubble(c,grid);
            if (_Var1) {
              pcVar4 = ":";
              goto LAB_00153558;
            }
            _Var1 = square_isdownstairs(c,grid);
            if (_Var1) {
              pcVar4 = "&gt;";
              goto LAB_00153558;
            }
            _Var1 = square_isupstairs(c,grid);
            if (_Var1) {
              pcVar4 = "&lt;";
              goto LAB_00153558;
            }
            _Var1 = square_istrap(c,grid);
            if ((_Var1) || (_Var1 = square_isplayertrap(c,grid), _Var1)) {
              pcVar4 = "^";
              goto LAB_00153558;
            }
            _Var1 = square_iswebbed(c,grid);
            if (_Var1) {
              pcVar4 = "w";
              goto LAB_00153558;
            }
            poVar2 = square_object(c,grid);
            if (poVar2 != (object *)0x0) {
              pcVar4 = "$";
              goto LAB_00153558;
            }
            _Var1 = square_isempty(c,grid);
            if ((_Var1) &&
               ((_Var1 = square_isvault(c,grid), _Var1 ||
                (_Var1 = square_isno_stairs(c,grid), _Var1)))) {
              pcVar4 = " ";
              goto LAB_00153558;
            }
            _Var1 = square_ispassable(c,grid);
            buf = ".";
            if (!_Var1) {
              buf = "#";
            }
            pcVar4 = ".";
            if (dist == (int **)0x0 || !_Var1) goto LAB_0015357c;
          }
          buf = pcVar4;
          if (dist[lVar5][lVar3] < 0) {
            buf = "*";
          }
        }
      }
LAB_0015357c:
      file_put(fo,buf);
    }
    file_put(fo,"\n");
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void dump_level_body(ang_file *fo, const char *title, struct chunk *c,
	int **dist)
{
	int y;

	file_put(fo, "    <p>");
	dump_level_escaped_string(fo, title);
	if (dist != NULL) {
		file_put(fo, "\n    <p>A location where the distance array was negative is marked with *.");
	}
	file_put(fo, "\n    <pre>\n");
	for (y = 0; y < c->height; ++y) {
		int x;

		for (x = 0; x < c->width; ++x) {
			struct loc grid = loc(x, y);
			const char *s = "#";

			if (square_in_bounds_fully(c, grid)) {
				if (square_isplayer(c, grid)) {
					s = "@";
				} else if (square_isoccupied(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"M" : "*";
				} else if (square_isdoor(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"+" : "*";
				} else if (square_isrubble(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						":" : "*";
				} else if (square_isdownstairs(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"&gt;" : "*";
				} else if (square_isupstairs(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"&lt;" : "*";
				} else if (square_istrap(c, grid) ||
					square_isplayertrap(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"^" : "*";
				} else if (square_iswebbed(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"w" : "*";
				} else if (square_object(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"$" : "*";
				} else if (square_isempty(c, grid) &&
						(square_isvault(c, grid) ||
						square_isno_stairs(c, grid))) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						" " : "*";
				} else if (square_ispassable(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"." : "*";
				}
			}
			file_put(fo, s);
		}
		file_put(fo, "\n");
	}
	file_put(fo, "    </pre>\n");
}